

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::unsimplify
          (SPxMainSM<double> *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s
          ,VectorBase<double> *r,VarStatus *rows,VarStatus *cols,bool isOptimal)

{
  double dVar1;
  VarStatus VVar2;
  SPxOut *pSVar3;
  bool bVar4;
  Verbosity VVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  VarStatus *pVVar9;
  element_type *peVar10;
  undefined4 extraout_var;
  SPxMainSM<double> *in_RDI;
  long in_R9;
  long in_stack_00000008;
  byte in_stack_00000010;
  int i_1;
  int j_1;
  Verbosity old_verbosity_1;
  SPxException *ex;
  int k;
  int i;
  int j;
  Verbosity old_verbosity;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  SPxMainSM<double> *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  VectorBase<double> *in_stack_fffffffffffffe30;
  double local_150;
  double local_138;
  double local_130;
  double local_108;
  double local_100;
  double local_e8;
  int local_c4;
  int local_c0;
  char *local_58;
  int local_50;
  int local_4c;
  int local_48;
  undefined4 local_44;
  Verbosity local_40;
  byte local_39;
  long local_38;
  
  local_39 = in_stack_00000010 & 1;
  local_38 = in_R9;
  if (((in_RDI->super_SPxSimplifier<double>).spxout != (SPxOut *)0x0) &&
     (VVar5 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout), 2 < (int)VVar5)) {
    local_40 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout);
    pSVar3 = (in_RDI->super_SPxSimplifier<double>).spxout;
    local_44 = 3;
    (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_44);
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (char *)in_stack_fffffffffffffdf8);
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffdf8);
    pSVar3 = (in_RDI->super_SPxSimplifier<double>).spxout;
    (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_40);
  }
  for (local_48 = 0; iVar7 = local_48,
      iVar6 = VectorBase<double>::dim((VectorBase<double> *)0x265c43), iVar7 < iVar6;
      local_48 = local_48 + 1) {
    VectorBase<double>::operator[]
              ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    epsZero(in_stack_fffffffffffffe20);
    bVar4 = isZero<double,double>
                      ((double)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (double)in_stack_fffffffffffffdf8);
    if (bVar4) {
      local_e8 = 0.0;
    }
    else {
      pdVar8 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      local_e8 = *pdVar8;
    }
    pdVar8 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    *pdVar8 = local_e8;
    VectorBase<double>::operator[]
              ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    epsZero(in_stack_fffffffffffffe20);
    bVar4 = isZero<double,double>
                      ((double)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (double)in_stack_fffffffffffffdf8);
    if (bVar4) {
      local_100 = 0.0;
    }
    else {
      iVar7 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      if (in_RDI->m_thesense == MAXIMIZE) {
        pdVar8 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7);
        local_108 = -*pdVar8;
      }
      else {
        pdVar8 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7);
        local_108 = *pdVar8;
      }
      local_100 = local_108;
    }
    pdVar8 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    *pdVar8 = local_100;
    VVar2 = *(VarStatus *)(in_stack_00000008 + (long)local_48 * 4);
    pVVar9 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (&in_RDI->m_cBasisStat,local_48);
    *pVVar9 = VVar2;
  }
  for (local_4c = 0; iVar7 = local_4c,
      iVar6 = VectorBase<double>::dim((VectorBase<double> *)0x265e84), iVar7 < iVar6;
      local_4c = local_4c + 1) {
    VectorBase<double>::operator[]
              ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    epsZero(in_stack_fffffffffffffe20);
    bVar4 = isZero<double,double>
                      ((double)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (double)in_stack_fffffffffffffdf8);
    if (bVar4) {
      local_130 = 0.0;
    }
    else {
      iVar7 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      if (in_RDI->m_thesense == MAXIMIZE) {
        pdVar8 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7);
        local_138 = -*pdVar8;
      }
      else {
        pdVar8 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7);
        local_138 = *pdVar8;
      }
      local_130 = local_138;
    }
    pdVar8 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    *pdVar8 = local_130;
    VectorBase<double>::operator[]
              ((VectorBase<double> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    epsZero(in_stack_fffffffffffffe20);
    bVar4 = isZero<double,double>
                      ((double)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (double)in_stack_fffffffffffffdf8);
    if (bVar4) {
      local_150 = 0.0;
    }
    else {
      pdVar8 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      local_150 = *pdVar8;
    }
    pdVar8 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    *pdVar8 = local_150;
    VVar2 = *(VarStatus *)(local_38 + (long)local_4c * 4);
    pVVar9 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (&in_RDI->m_rBasisStat,local_4c);
    *pVVar9 = VVar2;
  }
  local_50 = Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::size
                       ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)0x2660b3);
  while( true ) {
    iVar7 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    local_50 = local_50 + -1;
    if (local_50 < 0) break;
    Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::operator[]
              ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7);
    peVar10 = std::
              __shared_ptr_access<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2660f6);
    iVar6 = (*peVar10->_vptr_PostStep[2])();
    local_58 = (char *)CONCAT44(extraout_var,iVar6);
    SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[19],_const_char_*,_0>
              (in_RDI,(char (*) [19])"unsimplifying {} \n",&local_58);
    Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::operator[]
              ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7);
    peVar10 = std::
              __shared_ptr_access<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x266151);
    in_stack_fffffffffffffdf8 = &in_RDI->m_rBasisStat;
    in_stack_fffffffffffffe00 = local_39 & 1;
    (*peVar10->_vptr_PostStep[4])
              (peVar10,&in_RDI->m_prim,&in_RDI->m_dual,&in_RDI->m_slack,&in_RDI->m_redCost,
               &in_RDI->m_cBasisStat);
    Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::reSize
              ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  }
  if (in_RDI->m_thesense == MAXIMIZE) {
    for (local_c0 = 0; iVar7 = VectorBase<double>::dim((VectorBase<double> *)0x266514),
        local_c0 < iVar7; local_c0 = local_c0 + 1) {
      pdVar8 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      dVar1 = *pdVar8;
      pdVar8 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      *pdVar8 = -dVar1;
    }
    local_c4 = 0;
    while( true ) {
      iVar6 = VectorBase<double>::dim((VectorBase<double> *)0x2665bf);
      iVar7 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      if (iVar6 <= local_c4) break;
      pdVar8 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7);
      in_stack_fffffffffffffe30 = (VectorBase<double> *)((ulong)*pdVar8 ^ 0x8000000000000000);
      pdVar8 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      *pdVar8 = (double)in_stack_fffffffffffffe30;
      local_c4 = local_c4 + 1;
    }
  }
  if (0 < in_RDI->m_addedcols) {
    VectorBase<double>::dim((VectorBase<double> *)0x266674);
    VectorBase<double>::reDim
              (in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
    VectorBase<double>::dim((VectorBase<double> *)0x2666b5);
    VectorBase<double>::reDim
              (in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe28 >> 0x18,0));
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(&in_RDI->m_cBasisStat);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7);
    DataArray<int>::size(&in_RDI->m_cIdx);
    DataArray<int>::reSize
              ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),iVar7
              );
  }
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::clear
            ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)0x266760);
  in_RDI->m_postsolved = true;
  return;
}

Assistant:

void SPxMainSM<R>::unsimplify(const VectorBase<R>& x, const VectorBase<R>& y,
                              const VectorBase<R>& s, const VectorBase<R>& r,
                              const typename SPxSolverBase<R>::VarStatus rows[],
                              const typename SPxSolverBase<R>::VarStatus cols[], bool isOptimal)
{
   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- unsimplifying solution and basis" << std::endl;)
   assert(x.dim() <= m_prim.dim());
   assert(y.dim() <= m_dual.dim());
   assert(x.dim() == r.dim());
   assert(y.dim() == s.dim());

   // assign values of variables in reduced LP
   // NOTE: for maximization problems, we have to switch signs of dual and reduced cost values,
   // since simplifier assumes minimization problem
   for(int j = 0; j < x.dim(); ++j)
   {
      m_prim[j] = isZero(x[j], this->epsZero()) ? 0.0 : x[j];
      m_redCost[j] = isZero(r[j], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -r[j] :
                     r[j]);
      m_cBasisStat[j] = cols[j];
   }

   for(int i = 0; i < y.dim(); ++i)
   {
      m_dual[i] = isZero(y[i], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -y[i] :
                  y[i]);
      m_slack[i] = isZero(s[i], this->epsZero()) ? 0.0 : s[i];
      m_rBasisStat[i] = rows[i];
   }

   // undo preprocessing
   for(int k = m_hist.size() - 1; k >= 0; --k)
   {
      SPxOut::debug(this, "unsimplifying {} \n", m_hist[k]->getName());

      try
      {
         m_hist[k]->execute(m_prim, m_dual, m_slack, m_redCost, m_cBasisStat, m_rBasisStat, isOptimal);
      }
      catch(const SPxException& ex)
      {
         SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Exception thrown while unsimplifying " <<
                       m_hist[k]->getName() << ":\n" << ex.what() << "\n");
         throw SPxInternalCodeException("XMAISM00 Exception thrown during unsimply().");
      }

      m_hist.reSize(k);
   }

   // for maximization problems, we have to switch signs of dual and reduced cost values back
   if(m_thesense == SPxLPBase<R>::MAXIMIZE)
   {
      for(int j = 0; j < m_redCost.dim(); ++j)
         m_redCost[j] = -m_redCost[j];

      for(int i = 0; i < m_dual.dim(); ++i)
         m_dual[i] = -m_dual[i];
   }

   if(m_addedcols > 0)
   {
      assert(m_prim.dim() >= m_addedcols);
      m_prim.reDim(m_prim.dim() - m_addedcols);
      m_redCost.reDim(m_redCost.dim() - m_addedcols);
      m_cBasisStat.reSize(m_cBasisStat.size() - m_addedcols);
      m_cIdx.reSize(m_cIdx.size() - m_addedcols);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM
   int numBasis = 0;

   for(int rs = 0; rs < m_rBasisStat.size(); ++rs)
   {
      if(m_rBasisStat[rs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   for(int cs = 0; cs < m_cBasisStat.size(); ++cs)
   {
      if(m_cBasisStat[cs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   if(numBasis != m_rBasisStat.size())
   {
      throw SPxInternalCodeException("XMAISM26 Dimension doesn't match after this step.");
   }

#endif

   m_hist.clear();
   m_postsolved = true;
}